

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O1

bool __thiscall spvtools::opt::IfConversion::CheckType(IfConversion *this,uint32_t id)

{
  Op opcode;
  IRContext *this_00;
  int32_t iVar1;
  Instruction *pIVar2;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  pIVar2 = analysis::DefUseManager::GetDef
                     ((this_00->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,id);
  opcode = pIVar2->opcode_;
  iVar1 = spvOpcodeIsScalarType(opcode);
  return (opcode == OpTypeVector || opcode == OpTypePointer) || iVar1 != 0;
}

Assistant:

bool IfConversion::CheckType(uint32_t id) {
  Instruction* type = get_def_use_mgr()->GetDef(id);
  spv::Op op = type->opcode();
  if (spvOpcodeIsScalarType(op) || op == spv::Op::OpTypePointer ||
      op == spv::Op::OpTypeVector)
    return true;
  return false;
}